

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  size_t __n;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  LRUHandle *pLVar4;
  ShardedLRUCache *pSVar5;
  size_t sVar6;
  uint32_t hash;
  uint uVar7;
  LRUHandle *this_00;
  LRUHandle **ppLVar8;
  uint uVar9;
  LRUHandle *pLVar10;
  LRUHandle *old;
  HandleTable *this_01;
  LRUCache *this_02;
  MutexLock l;
  MutexLock local_60;
  ShardedLRUCache *local_58;
  void *local_50;
  size_t local_48;
  Slice local_40;
  
  local_58 = this;
  local_50 = value;
  local_48 = charge;
  hash = HashSlice(key);
  uVar9 = hash >> 0x1c;
  local_60.mu_ = &this->shard_[uVar9].mutex_;
  port::Mutex::Lock(local_60.mu_);
  __n = key->size_;
  this_00 = (LRUHandle *)malloc(__n + 0x47);
  sVar6 = local_48;
  pSVar5 = local_58;
  this_00->value = local_50;
  this_00->deleter = deleter;
  this_00->charge = local_48;
  this_00->key_length = __n;
  this_00->hash = hash;
  this_00->refs = 2;
  memcpy(this_00->key_data,key->data_,__n);
  pLVar10 = &pSVar5->shard_[uVar9].lru_;
  this_00->next = pLVar10;
  pLVar2 = pSVar5->shard_[uVar9].lru_.prev;
  this_00->prev = pLVar2;
  pLVar2->next = this_00;
  pSVar5->shard_[uVar9].lru_.prev = this_00;
  psVar1 = &pSVar5->shard_[uVar9].usage_;
  *psVar1 = *psVar1 + sVar6;
  this_01 = &pSVar5->shard_[uVar9].table_;
  local_40 = LRUHandle::key(this_00);
  ppLVar8 = HandleTable::FindPointer(this_01,&local_40,hash);
  this_02 = pSVar5->shard_ + uVar9;
  pLVar2 = *ppLVar8;
  if (pLVar2 == (LRUHandle *)0x0) {
    this_00->next_hash = (LRUHandle *)0x0;
    *ppLVar8 = this_00;
    uVar7 = pSVar5->shard_[uVar9].table_.elems_ + 1;
    pSVar5->shard_[uVar9].table_.elems_ = uVar7;
    if (pSVar5->shard_[uVar9].table_.length_ < uVar7) {
      HandleTable::Resize(this_01);
    }
  }
  else {
    this_00->next_hash = pLVar2->next_hash;
    *ppLVar8 = this_00;
    pLVar3 = pLVar2->next;
    pLVar4 = pLVar2->prev;
    pLVar3->prev = pLVar4;
    pLVar4->next = pLVar3;
    LRUCache::Unref(this_02,pLVar2);
  }
  while ((this_02->capacity_ < pSVar5->shard_[uVar9].usage_ &&
         (pLVar2 = pSVar5->shard_[uVar9].lru_.next, pLVar2 != pLVar10))) {
    pLVar3 = pLVar2->next;
    pLVar4 = pLVar2->prev;
    pLVar3->prev = pLVar4;
    pLVar4->next = pLVar3;
    local_40 = LRUHandle::key(pLVar2);
    HandleTable::Remove(this_01,&local_40,pLVar2->hash);
    LRUCache::Unref(this_02,pLVar2);
  }
  MutexLock::~MutexLock(&local_60);
  return (Handle *)this_00;
}

Assistant:

virtual Handle *Insert(const Slice &key, void *value, size_t charge,
                                   void (*deleter)(const Slice &key, void *value)) {
                const uint32_t hash = HashSlice(key);
                return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
            }